

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintWithFallback<std::multiset<long_double,std::less<long_double>,std::allocator<long_double>>>
               (multiset<long_double,_std::less<long_double>,_std::allocator<long_double>_> *value,
               ostream *os)

{
  ostream *os_local;
  multiset<long_double,_std::less<long_double>,_std::allocator<long_double>_> *value_local;
  
  ContainerPrinter::
  PrintValue<std::multiset<long_double,std::less<long_double>,std::allocator<long_double>>,void>
            (value,os);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ProtobufPrinter, ConvertibleToIntegerPrinter,
      ConvertibleToStringViewPrinter, RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}